

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xgemm.c
# Opt level: O0

void xb_zgemm(char *transa,char *transb,int *M,int *N,int *K,void *alpha,void *a,int *p_lda,void *b,
             int *p_ldb,void *beta,void *c,int *p_ldc)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int *in_RCX;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int *in_R8;
  double *in_R9;
  int ldc;
  int ldb;
  int lda;
  int k;
  int n;
  int m;
  double *beta_i;
  double *alpha_i;
  double *c_i;
  double *b_i;
  double *a_i;
  int inccij;
  int incci;
  int incbhj;
  int incbj;
  int incaih;
  int incai;
  int cij;
  int bhj;
  int aih;
  int ci;
  int bj;
  int ai;
  int h;
  int j;
  int i;
  double local_108;
  double local_100;
  double local_d0;
  double local_c0;
  char order;
  double tmp2 [2];
  double tmp1 [2];
  double sum [2];
  double prod [2];
  double c_elem [2];
  double b_elem [2];
  double a_elem [2];
  
  iVar6 = *in_RDX;
  iVar7 = *in_RCX;
  iVar8 = *in_R8;
  iVar9 = *_lda;
  iVar10 = *(int *)beta_i;
  if ((((0 < iVar6) && (0 < iVar7)) && (0 < iVar8)) && (iVar6 <= *(int *)b_i)) {
    iVar11 = iVar6;
    if ((*in_RDI != 'n') && (*in_RDI != 'N')) {
      iVar11 = iVar8;
    }
    if (iVar11 <= iVar9) {
      iVar11 = iVar8;
      if ((*in_RSI != 'n') && (*in_RSI != 'N')) {
        iVar11 = iVar7;
      }
      if ((iVar11 <= iVar10) &&
         ((((*in_R9 != 0.0 || (NAN(*in_R9))) || (in_R9[1] != 0.0)) ||
          (((NAN(in_R9[1]) || (*alpha_i != 1.0)) ||
           ((NAN(*alpha_i) || ((alpha_i[1] != 0.0 || (NAN(alpha_i[1]))))))))))) {
        if ((*in_RDI == 'n') || (*in_RDI == 'N')) {
          tmp1[1]._0_4_ = 1;
          tmp1[0]._4_4_ = iVar9;
        }
        else {
          tmp1[0]._4_4_ = 1;
          tmp1[1]._0_4_ = iVar9;
        }
        if ((*in_RSI == 'n') || (*in_RSI == 'N')) {
          tmp2[1]._4_4_ = 1;
          tmp1[0]._0_4_ = iVar10;
        }
        else {
          tmp1[0]._0_4_ = 1;
          tmp2[1]._4_4_ = iVar10;
        }
        iVar9 = *(int *)b_i * 2;
        iVar10 = tmp1[1]._0_4_ * 2;
        iVar11 = tmp1[0]._4_4_ * 2;
        iVar12 = tmp1[0]._0_4_ * 2;
        iVar13 = tmp2[1]._4_4_ * 2;
        if ((((*in_R9 != 0.0) || (NAN(*in_R9))) || (in_R9[1] != 0.0)) || (NAN(in_R9[1]))) {
          if (((*in_R9 != 1.0) || (NAN(*in_R9))) || ((in_R9[1] != 0.0 || (NAN(in_R9[1]))))) {
            sum[1]._0_4_ = 0;
            prod[0]._0_4_ = 0;
            for (prod[1]._4_4_ = 0; prod[1]._4_4_ < iVar6; prod[1]._4_4_ = prod[1]._4_4_ + 1) {
              tmp1[1]._4_4_ = sum[1]._0_4_;
              sum[1]._4_4_ = 0;
              for (prod[1]._0_4_ = 0; prod[1]._0_4_ < iVar7; prod[1]._0_4_ = prod[1]._0_4_ + 1) {
                sum[0]._4_4_ = prod[0]._0_4_;
                sum[0]._0_4_ = sum[1]._4_4_;
                local_100 = 0.0;
                local_108 = 0.0;
                for (prod[0]._4_4_ = 0; prod[0]._4_4_ < iVar8; prod[0]._4_4_ = prod[0]._4_4_ + 1) {
                  dVar1 = *(double *)(_ldc + (long)sum[0]._4_4_ * 8);
                  local_c0 = *(double *)(_ldc + (long)(sum[0]._4_4_ + 1) * 8);
                  dVar2 = *(double *)(_n + (long)sum[0]._0_4_ * 8);
                  local_d0 = *(double *)(_n + (long)(sum[0]._0_4_ + 1) * 8);
                  if ((*in_RDI == 'c') || (*in_RDI == 'C')) {
                    local_c0 = -local_c0;
                  }
                  if ((*in_RSI == 'c') || (*in_RSI == 'C')) {
                    local_d0 = -local_d0;
                  }
                  local_108 = local_108 + dVar1 * dVar2 + -(local_c0 * local_d0);
                  local_100 = local_100 + dVar1 * local_d0 + local_c0 * dVar2;
                  sum[0]._4_4_ = iVar11 + sum[0]._4_4_;
                  sum[0]._0_4_ = iVar13 + sum[0]._0_4_;
                }
                dVar1 = in_R9[1];
                dVar2 = *in_R9;
                dVar3 = c_i[tmp1[1]._4_4_];
                dVar4 = alpha_i[1];
                dVar5 = *alpha_i;
                c_i[tmp1[1]._4_4_] =
                     local_108 * *in_R9 + -(local_100 * in_R9[1]) +
                     dVar3 * *alpha_i + -(c_i[tmp1[1]._4_4_ + 1] * alpha_i[1]);
                c_i[tmp1[1]._4_4_ + 1] =
                     local_108 * dVar1 + local_100 * dVar2 +
                     dVar3 * dVar4 + c_i[tmp1[1]._4_4_ + 1] * dVar5;
                tmp1[1]._4_4_ = iVar9 + tmp1[1]._4_4_;
                sum[1]._4_4_ = iVar12 + sum[1]._4_4_;
              }
              sum[1]._0_4_ = sum[1]._0_4_ + 2;
              prod[0]._0_4_ = iVar10 + prod[0]._0_4_;
            }
          }
          else if ((((*alpha_i != 0.0) || (NAN(*alpha_i))) || (alpha_i[1] != 0.0)) ||
                  (NAN(alpha_i[1]))) {
            sum[1]._0_4_ = 0;
            prod[0]._0_4_ = 0;
            for (prod[1]._4_4_ = 0; prod[1]._4_4_ < iVar6; prod[1]._4_4_ = prod[1]._4_4_ + 1) {
              tmp1[1]._4_4_ = sum[1]._0_4_;
              sum[1]._4_4_ = 0;
              for (prod[1]._0_4_ = 0; prod[1]._0_4_ < iVar7; prod[1]._0_4_ = prod[1]._0_4_ + 1) {
                sum[0]._4_4_ = prod[0]._0_4_;
                sum[0]._0_4_ = sum[1]._4_4_;
                local_100 = 0.0;
                local_108 = 0.0;
                for (prod[0]._4_4_ = 0; prod[0]._4_4_ < iVar8; prod[0]._4_4_ = prod[0]._4_4_ + 1) {
                  dVar1 = *(double *)(_ldc + (long)sum[0]._4_4_ * 8);
                  local_c0 = *(double *)(_ldc + (long)(sum[0]._4_4_ + 1) * 8);
                  dVar2 = *(double *)(_n + (long)sum[0]._0_4_ * 8);
                  local_d0 = *(double *)(_n + (long)(sum[0]._0_4_ + 1) * 8);
                  if ((*in_RDI == 'c') || (*in_RDI == 'C')) {
                    local_c0 = -local_c0;
                  }
                  if ((*in_RSI == 'c') || (*in_RSI == 'C')) {
                    local_d0 = -local_d0;
                  }
                  local_108 = local_108 + dVar1 * dVar2 + -(local_c0 * local_d0);
                  local_100 = local_100 + dVar1 * local_d0 + local_c0 * dVar2;
                  sum[0]._4_4_ = iVar11 + sum[0]._4_4_;
                  sum[0]._0_4_ = iVar13 + sum[0]._0_4_;
                }
                dVar1 = c_i[tmp1[1]._4_4_];
                dVar2 = alpha_i[1];
                dVar3 = *alpha_i;
                c_i[tmp1[1]._4_4_] =
                     dVar1 * *alpha_i + -(c_i[tmp1[1]._4_4_ + 1] * alpha_i[1]) + local_108;
                c_i[tmp1[1]._4_4_ + 1] = dVar1 * dVar2 + c_i[tmp1[1]._4_4_ + 1] * dVar3 + local_100;
                tmp1[1]._4_4_ = iVar9 + tmp1[1]._4_4_;
                sum[1]._4_4_ = iVar12 + sum[1]._4_4_;
              }
              sum[1]._0_4_ = sum[1]._0_4_ + 2;
              prod[0]._0_4_ = iVar10 + prod[0]._0_4_;
            }
          }
          else {
            sum[1]._0_4_ = 0;
            prod[0]._0_4_ = 0;
            for (prod[1]._4_4_ = 0; prod[1]._4_4_ < iVar6; prod[1]._4_4_ = prod[1]._4_4_ + 1) {
              tmp1[1]._4_4_ = sum[1]._0_4_;
              sum[1]._4_4_ = 0;
              for (prod[1]._0_4_ = 0; prod[1]._0_4_ < iVar7; prod[1]._0_4_ = prod[1]._0_4_ + 1) {
                sum[0]._4_4_ = prod[0]._0_4_;
                sum[0]._0_4_ = sum[1]._4_4_;
                local_100 = 0.0;
                local_108 = 0.0;
                for (prod[0]._4_4_ = 0; prod[0]._4_4_ < iVar8; prod[0]._4_4_ = prod[0]._4_4_ + 1) {
                  dVar1 = *(double *)(_ldc + (long)sum[0]._4_4_ * 8);
                  local_c0 = *(double *)(_ldc + (long)(sum[0]._4_4_ + 1) * 8);
                  dVar2 = *(double *)(_n + (long)sum[0]._0_4_ * 8);
                  local_d0 = *(double *)(_n + (long)(sum[0]._0_4_ + 1) * 8);
                  if ((*in_RDI == 'c') || (*in_RDI == 'C')) {
                    local_c0 = -local_c0;
                  }
                  if ((*in_RSI == 'c') || (*in_RSI == 'C')) {
                    local_d0 = -local_d0;
                  }
                  local_108 = local_108 + dVar1 * dVar2 + -(local_c0 * local_d0);
                  local_100 = local_100 + dVar1 * local_d0 + local_c0 * dVar2;
                  sum[0]._4_4_ = iVar11 + sum[0]._4_4_;
                  sum[0]._0_4_ = iVar13 + sum[0]._0_4_;
                }
                c_i[tmp1[1]._4_4_] = local_108;
                c_i[tmp1[1]._4_4_ + 1] = local_100;
                tmp1[1]._4_4_ = iVar9 + tmp1[1]._4_4_;
                sum[1]._4_4_ = iVar12 + sum[1]._4_4_;
              }
              sum[1]._0_4_ = sum[1]._0_4_ + 2;
              prod[0]._0_4_ = iVar10 + prod[0]._0_4_;
            }
          }
        }
        else {
          sum[1]._0_4_ = 0;
          for (prod[1]._4_4_ = 0; prod[1]._4_4_ < iVar6; prod[1]._4_4_ = prod[1]._4_4_ + 1) {
            tmp1[1]._4_4_ = sum[1]._0_4_;
            for (prod[1]._0_4_ = 0; prod[1]._0_4_ < iVar7; prod[1]._0_4_ = prod[1]._0_4_ + 1) {
              dVar1 = c_i[tmp1[1]._4_4_];
              dVar2 = alpha_i[1];
              dVar3 = *alpha_i;
              c_i[tmp1[1]._4_4_] = dVar1 * *alpha_i + -(c_i[tmp1[1]._4_4_ + 1] * alpha_i[1]);
              c_i[tmp1[1]._4_4_ + 1] = dVar1 * dVar2 + c_i[tmp1[1]._4_4_ + 1] * dVar3;
              tmp1[1]._4_4_ = iVar9 + tmp1[1]._4_4_;
            }
            sum[1]._0_4_ = sum[1]._0_4_ + 2;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
xb_zgemm (char * transa, char *transb, int *M, int *N, int *K,
	  const void *alpha, const void *a, int *p_lda, const void *b, 
	  int *p_ldb, const void *beta, void *c, int *p_ldc)
/* 
 * Purpose
 * =======
 *
 * This routine computes the matrix product:
 *
 *      C   <-  alpha * op(A) * op(B)  +  beta * C .
 * 
 * where op(M) represents either M, M transpose, 
 * or M conjugate transpose.
 *
 * Arguments
 * =========
 *
 * order   (input) enum blas_order_type
 *         Storage  of input matrices A, B, and C.
 *
 * transa  (input) enum blas_trans_type
 *         Operation to be done on matrix A before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 *
 * transb  (input) enum blas_trans_type
 *         Operation to be done on matrix B before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 * 
 * m n k   (input) int
 *         The dimensions of matrices A, B, and C.
 *         Matrix C is m-by-n matrix.
 *         Matrix A is m-by-k if A is not transposed, 
 *                     k-by-m otherwise.
 *         Matrix B is k-by-n if B is not transposed, 
 *                     n-by-k otherwise.
 *      
 * alpha   (input) const void*
 *
 * a       (input) const void*
 *         matrix A.
 * 
 * lda     (input) int
 *         leading dimension of A.
 * 
 * b       (input) const void*
 *         matrix B
 *
 * ldb     (input) int
 *         leading dimension of B.
 *
 * beta    (input) const void*
 *
 * c       (input/output) void*
 *         matrix C
 *
 * ldc     (input) int
 *         leading dimension of C.
 *
 */
{


    /* Integer Index Variables */
    int i, j, h;

    int ai, bj, ci;
    int aih, bhj, cij;		/* Index into matrices a, b, c during multiply */

    int incai, incaih;		/* Index increments for matrix a */
    int incbj, incbhj;		/* Index increments for matrix b */
    int incci, inccij;		/* Index increments for matrix c */

    /* Input Matrices */
    const double *a_i = (double *) a;
    const double *b_i = (double *) b;

    /* Output Matrix */
    double *c_i = (double *) c;

    /* Input Scalars */
    double *alpha_i = (double *) alpha;
    double *beta_i = (double *) beta;
    int m=*M, n=*N, k=*K;
    int lda=*p_lda, ldb=*p_ldb, ldc=*p_ldc;

    /* Temporary Floating-Point Variables */
    double a_elem[2];
    double b_elem[2];
    double c_elem[2];
    double prod[2];
    double sum[2];
    double tmp1[2];
    double tmp2[2];

    char order = COLMAJOR; /* For the time being, it is always COLMAJOR.
			      Eventually, it might change. */

#if MDEBUG
    printf("In Zgemm\n");
#endif

    /* Test for error conditions */
    if (m <= 0 || n <= 0 || k <= 0)
    {
	return;
    }

    if (order == COLMAJOR)
    {

	if (ldc < m)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < m)
		return;
	}
	else
	{
	    if (lda < k)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < k)
		return;
	}
	else
	{
	    if (ldb < n)
		return;
	}

    }
    else
    {
	/* row major */
	if (ldc < n)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < k)
		return;
	}
	else
	{
	    if (lda < m)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < n)
		return;
	}
	else
	{
	    if (ldb < k)
		return;
	}
    }

    /* Test for no-op */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0
	&& (beta_i[0] == 1.0 && beta_i[1] == 0.0))
    {
	return;
    }

    /* Set Index Parameters */
    if (order == COLMAJOR)
    {
	incci = 1;
	inccij = ldc;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = 1;
	    incaih = lda;
	}
	else
	{
	    incai = lda;
	    incaih = 1;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = ldb;
	    incbhj = 1;
	}
	else
	{
	    incbj = 1;
	    incbhj = ldb;
	}

    }
    else
    {
	/* row major */
	incci = ldc;
	inccij = 1;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = lda;
	    incaih = 1;
	}
	else
	{
	    incai = 1;
	    incaih = lda;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = 1;
	    incbhj = ldb;
	}
	else
	{
	    incbj = ldb;
	    incbhj = 1;
	}

    }



    /* Ajustment to increments */
    incci *= 2;
    inccij *= 2;
    incai *= 2;
    incaih *= 2;
    incbj *= 2;
    incbhj *= 2;

    /* alpha = 0.  In this case, just return beta * C */
    if (alpha_i[0] == 0.0 && alpha_i[1] == 0.0)
    {

	ci = 0;
	for (i = 0; i < m; i++, ci += incci)
	{
	    cij = ci;
	    for (j = 0; j < n; j++, cij += inccij)
	    {
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp1[0] =
			(double) c_elem[0] * beta_i[0] -
			(double) c_elem[1] * beta_i[1];
		    tmp1[1] =
			(double) c_elem[0] * beta_i[1] +
			(double) c_elem[1] * beta_i[0];
		}
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }
    else if ((alpha_i[0] == 1.0 && alpha_i[1] == 0.0))
    {

	/* Case alpha == 1. */

	if (beta_i[0] == 0.0 && beta_i[1] == 0.0)
	{
	    /* Case alpha == 1, beta == 0.   We compute  C <--- A * B */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			  a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			
			{
			    prod[0] =
				(double) a_elem[0] * b_elem[0] -
				(double) a_elem[1] * b_elem[1];
			    prod[1] =
				(double) a_elem[0] * b_elem[1] +
				(double) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }

	}
	else
	{
	    /* Case alpha == 1, but beta != 0.
	       We compute   C <--- A * B + beta * C   */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum[0] = sum[1] = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem[0] = a_i[aih];
			a_elem[1] = a_i[aih + 1];
			b_elem[0] = b_i[bhj];
			b_elem[1] = b_i[bhj + 1];
			if (*transa == 'c' || *transa == 'C')
			{
			    a_elem[1] = -a_elem[1];
			}
			if (*transb == 'c' || *transb == 'C')
			{
			    b_elem[1] = -b_elem[1];
			}
			{
			    prod[0] =
				(double) a_elem[0] * b_elem[0] -
				(double) a_elem[1] * b_elem[1];
			    prod[1] =
				(double) a_elem[0] * b_elem[1] +
				(double) a_elem[1] * b_elem[0];
			}
			sum[0] = sum[0] + prod[0];
			sum[1] = sum[1] + prod[1];
		    }

		    c_elem[0] = c_i[cij];
		    c_elem[1] = c_i[cij + 1];
		    {
			tmp2[0] =
			    (double) c_elem[0] * beta_i[0] -
			    (double) c_elem[1] * beta_i[1];
			tmp2[1] =
			    (double) c_elem[0] * beta_i[1] +
			    (double) c_elem[1] * beta_i[0];
		    }
		    tmp1[0] = sum[0];
		    tmp1[1] = sum[1];
		    tmp1[0] = tmp2[0] + tmp1[0];
		    tmp1[1] = tmp2[1] + tmp1[1];
		    c_i[cij] = tmp1[0];
		    c_i[cij + 1] = tmp1[1];
		}
	    }
	}

    }
    else
    {

	/* The most general form,   C <-- alpha * A * B + beta * C  */
	ci = 0;
	ai = 0;
	for (i = 0; i < m; i++, ci += incci, ai += incai)
	{

	    cij = ci;
	    bj = 0;

	    for (j = 0; j < n; j++, cij += inccij, bj += incbj)
	    {

		aih = ai;
		bhj = bj;

		sum[0] = sum[1] = 0.0;

		for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		{
		    a_elem[0] = a_i[aih];
		    a_elem[1] = a_i[aih + 1];
		    b_elem[0] = b_i[bhj];
		    b_elem[1] = b_i[bhj + 1];
		    if (*transa == 'c' || *transa == 'C')
		    {
			a_elem[1] = -a_elem[1];
		    }
		    if (*transb == 'c' || *transb == 'C')
		    {
			b_elem[1] = -b_elem[1];
		    }
		    {
			prod[0] =
			    (double) a_elem[0] * b_elem[0] -
			    (double) a_elem[1] * b_elem[1];
			prod[1] =
			    (double) a_elem[0] * b_elem[1] +
			    (double) a_elem[1] * b_elem[0];
		    }
		    sum[0] = sum[0] + prod[0];
		    sum[1] = sum[1] + prod[1];
		}

		{
		    tmp1[0] =
			(double) sum[0] * alpha_i[0] -
			(double) sum[1] * alpha_i[1];
		    tmp1[1] =
			(double) sum[0] * alpha_i[1] +
			(double) sum[1] * alpha_i[0];
		}
		c_elem[0] = c_i[cij];
		c_elem[1] = c_i[cij + 1];
		{
		    tmp2[0] =
			(double) c_elem[0] * beta_i[0] -
			(double) c_elem[1] * beta_i[1];
		    tmp2[1] =
			(double) c_elem[0] * beta_i[1] +
			(double) c_elem[1] * beta_i[0];
		}
		tmp1[0] = tmp1[0] + tmp2[0];
		tmp1[1] = tmp1[1] + tmp2[1];
		c_i[cij] = tmp1[0];
		c_i[cij + 1] = tmp1[1];
	    }
	}

    }



}